

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall
kj::VectorOutputStream::VectorOutputStream(VectorOutputStream *this,size_t initialCapacity)

{
  uchar *puVar1;
  
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__VectorOutputStream_001c3848;
  puVar1 = (uchar *)_::HeapArrayDisposer::allocateImpl
                              (1,initialCapacity,initialCapacity,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
  (this->vector).ptr = puVar1;
  (this->vector).size_ = initialCapacity;
  (this->vector).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  this->fillPos = puVar1;
  return;
}

Assistant:

VectorOutputStream::VectorOutputStream(size_t initialCapacity)
    : vector(heapArray<byte>(initialCapacity)), fillPos(vector.begin()) {}